

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall wasm_func_t::wasm_func_t(wasm_func_t *this,RefPtr<wabt::interp::Func> *ptr)

{
  RefPtr<wabt::interp::Extern> RStack_28;
  
  wabt::interp::RefPtr<wabt::interp::Extern>::RefPtr<wabt::interp::Func>(&RStack_28,ptr);
  wasm_extern_t::wasm_extern_t(&this->super_wasm_extern_t,&RStack_28);
  wabt::interp::RefPtr<wabt::interp::Extern>::reset(&RStack_28);
  return;
}

Assistant:

wasm_func_t(RefPtr<Func> ptr) : wasm_extern_t(ptr) {}